

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::PrivateToLocalPass::UpdateUse
          (PrivateToLocalPass *this,Instruction *inst,Instruction *user)

{
  uint uVar1;
  bool bVar2;
  CommonDebugInfoInstructions CVar3;
  uint32_t uVar4;
  DebugInfoManager *this_00;
  
  CVar3 = Instruction::GetCommonDebugOpcode(inst);
  if (CVar3 == CommonDebugInfoDebugGlobalVariable) {
    this_00 = IRContext::get_debug_info_mgr((this->super_Pass).context_);
    analysis::DebugInfoManager::ConvertDebugGlobalToLocalVariable(this_00,inst,user);
    return true;
  }
  uVar1 = inst->opcode_ - OpName;
  if (uVar1 < 0x3d) {
    if ((0x380000000000401U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
      return true;
    }
    if ((ulong)uVar1 == 0x3c) {
      IRContext::ForgetUses((this->super_Pass).context_,inst);
      uVar4 = Instruction::type_id(inst);
      uVar4 = GetNewType(this,uVar4);
      if (uVar4 != 0) {
        Instruction::SetResultType(inst,uVar4);
        IRContext::AnalyzeUses((this->super_Pass).context_,inst);
        bVar2 = UpdateUses(this,inst);
        if (bVar2) {
          return true;
        }
      }
      return false;
    }
  }
  bVar2 = spvOpcodeIsDecoration(inst->opcode_);
  if (bVar2) {
    return true;
  }
  __assert_fail("spvOpcodeIsDecoration(inst->opcode()) && \"Do not know how to update the type for this instruction.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/private_to_local_pass.cpp"
                ,0xd7,
                "bool spvtools::opt::PrivateToLocalPass::UpdateUse(Instruction *, Instruction *)");
}

Assistant:

bool PrivateToLocalPass::UpdateUse(Instruction* inst, Instruction* user) {
  // The cases in this switch have to match the cases in |IsValidUse|.  If we
  // don't think it is valid, the optimization will not view the variable as a
  // candidate, and therefore the use will not be updated.
  if (inst->GetCommonDebugOpcode() == CommonDebugInfoDebugGlobalVariable) {
    context()->get_debug_info_mgr()->ConvertDebugGlobalToLocalVariable(inst,
                                                                       user);
    return true;
  }
  switch (inst->opcode()) {
    case spv::Op::OpLoad:
    case spv::Op::OpStore:
    case spv::Op::OpImageTexelPointer:  // Treat like a load
      // The type is fine because it is the type pointed to, and that does not
      // change.
      break;
    case spv::Op::OpAccessChain: {
      context()->ForgetUses(inst);
      uint32_t new_type_id = GetNewType(inst->type_id());
      if (new_type_id == 0) {
        return false;
      }
      inst->SetResultType(new_type_id);
      context()->AnalyzeUses(inst);

      // Update uses where the type may have changed.
      if (!UpdateUses(inst)) {
        return false;
      }
    } break;
    case spv::Op::OpName:
    case spv::Op::OpEntryPoint:  // entry points will be updated separately.
      break;
    default:
      assert(spvOpcodeIsDecoration(inst->opcode()) &&
             "Do not know how to update the type for this instruction.");
      break;
  }
  return true;
}